

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.h
# Opt level: O0

void __thiscall
soplex::SPxBasisBase<double>::coSolve
          (SPxBasisBase<double> *this,VectorBase<double> *x,VectorBase<double> *rhs)

{
  int iVar1;
  undefined8 in_RDX;
  VectorBase<double> *in_RSI;
  long in_RDI;
  SPxBasisBase<double> *in_stack_000000a0;
  
  iVar1 = VectorBase<double>::dim((VectorBase<double> *)0x27b417);
  if (iVar1 == 0) {
    VectorBase<double>::clear(in_RSI);
  }
  else {
    if ((*(byte *)(in_RDI + 0x50) & 1) == 0) {
      factorize(in_stack_000000a0);
    }
    (**(code **)(**(long **)(in_RDI + 0x48) + 0xa0))(*(long **)(in_RDI + 0x48),in_RSI,in_RDX);
  }
  return;
}

Assistant:

void coSolve(VectorBase<R>& x, const VectorBase<R>& rhs)
   {
      if(rhs.dim() == 0)
      {
         x.clear();
         return;
      }

      if(!factorized)
         SPxBasisBase<R>::factorize();

      factor->solveLeft(x, rhs);
   }